

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_ManPrepareCuts(Of_Cut_t *pCuts,Of_Man_t *p,int iObj,int fAddUnit)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  word wVar5;
  int *pList;
  int *pCut;
  Of_Cut_t *pOStack_30;
  int i;
  Of_Cut_t *pMfCut;
  int fAddUnit_local;
  int iObj_local;
  Of_Man_t *p_local;
  Of_Cut_t *pCuts_local;
  
  iVar1 = Of_ObjHasCuts(p,iObj);
  if (iVar1 == 0) {
    pCuts_local._4_4_ = Of_CutCreateUnit(pCuts,iObj);
  }
  else {
    piVar4 = Of_ObjCutSet(p,iObj);
    pCut._4_4_ = 0;
    pList = piVar4 + 1;
    pOStack_30 = pCuts;
    while (pCut._4_4_ < *piVar4) {
      pOStack_30->Delay = 0;
      pOStack_30->Flow = 0;
      uVar2 = Of_CutFunc(pList);
      *(uint *)&pOStack_30->field_0x10 =
           *(uint *)&pOStack_30->field_0x10 & 0xf8000000 | uVar2 & 0x7ffffff;
      iVar1 = Of_CutSize(pList);
      *(uint *)&pOStack_30->field_0x10 =
           *(uint *)&pOStack_30->field_0x10 & 0x7ffffff | iVar1 << 0x1b;
      iVar1 = Of_CutSize(pList);
      wVar5 = Of_CutGetSign(pList + 1,iVar1);
      pOStack_30->Sign = wVar5;
      iVar1 = Of_CutSize(pList);
      memcpy(pOStack_30->pLeaves,pList + 1,(long)iVar1 << 2);
      pOStack_30 = pOStack_30 + 1;
      pCut._4_4_ = pCut._4_4_ + 1;
      iVar1 = Of_CutSize(pList);
      pList = pList + (iVar1 + 4);
    }
    if ((fAddUnit == 0) || (*(uint *)&pCuts->field_0x10 >> 0x1b < 2)) {
      pCuts_local._4_4_ = *piVar4;
    }
    else {
      iVar1 = *piVar4;
      iVar3 = Of_CutCreateUnit(pOStack_30,iObj);
      pCuts_local._4_4_ = iVar1 + iVar3;
    }
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Of_ManPrepareCuts( Of_Cut_t * pCuts, Of_Man_t * p, int iObj, int fAddUnit )
{
    if ( Of_ObjHasCuts(p, iObj) )
    {
        Of_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Of_ObjCutSet(p, iObj);
        Of_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Of_CutFunc( pCut );
            pMfCut->nLeaves = Of_CutSize( pCut );
            pMfCut->Sign    = Of_CutGetSign( pCut+1, Of_CutSize(pCut) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Of_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Of_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Of_CutCreateUnit( pCuts, iObj );
}